

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  ulong *puVar5;
  _Head_base<0UL,_stress_instance_*,_false> _Var6;
  undefined8 extraout_RAX;
  long lVar7;
  long lVar8;
  char **ppcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar10;
  char *pcVar11;
  _Head_base<0UL,_stress_instance_*,_false> this;
  int iVar12;
  _Head_base<0UL,_stress_instance_*,_false> _Var13;
  ulong uVar14;
  double local_b8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
  local_b0;
  ulong local_a8;
  unique_lock<std::mutex> lock;
  unique_ptr<stress_instance[],_std::default_delete<stress_instance[]>_> instances;
  condition_variable dummyConditionVariable;
  mutex dummyMutex;
  
  bVar10 = false;
  iVar12 = 1;
  local_b8 = 1.0;
  uVar1 = 0;
  ppcVar9 = argv;
  do {
    iVar2 = (int)ppcVar9;
    if (argc <= iVar12) {
LAB_00103570:
      uVar3 = std::thread::hardware_concurrency();
      if ((int)uVar1 < 1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Using all ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," CPUs");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar1 = uVar3;
      }
      if ((ulong)uVar3 < (ulong)(long)(int)uVar1) {
        if (bVar10) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "Warning, forced to use more threads than CPUs, ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
          poVar4 = std::operator<<(poVar4," threads, but only ");
          pcVar11 = " CPUs detected!";
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Capping to ");
          pcVar11 = ". Use -f to override.";
          uVar1 = uVar3;
        }
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,pcVar11);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if (0x100 < uVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Capping to ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,". Recompile with higher max_threads.");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar1 = 0x100;
      }
      uVar14 = (ulong)uVar1;
      lVar7 = uVar14 * 0x98;
      local_a8 = lVar7 + 8;
      puVar5 = (ulong *)operator_new__(local_a8);
      *puVar5 = uVar14;
      _Var6._M_head_impl = (stress_instance *)(puVar5 + 1);
      _Var13._M_head_impl = _Var6._M_head_impl;
      instances._M_t.super___uniq_ptr_impl<stress_instance,_std::default_delete<stress_instance[]>_>
      ._M_t.super__Tuple_impl<0UL,_stress_instance_*,_std::default_delete<stress_instance[]>_>.
      super__Head_base<0UL,_stress_instance_*,_false>._M_head_impl =
           (__uniq_ptr_data<stress_instance,_std::default_delete<stress_instance[]>,_true,_true>)
           (__uniq_ptr_data<stress_instance,_std::default_delete<stress_instance[]>,_true,_true>)
           _Var6._M_head_impl;
      if (uVar1 != 0) {
        lVar8 = 0;
        this._M_head_impl = _Var6._M_head_impl;
        do {
          stress_instance::stress_instance(this._M_head_impl);
          lVar8 = lVar8 + -0x98;
          this._M_head_impl = this._M_head_impl + 0x98;
        } while (uVar14 * -0x98 - lVar8 != 0);
      }
      for (; lVar7 != 0; lVar7 = lVar7 + -0x98) {
        stress_instance::run(_Var13._M_head_impl);
        _Var13._M_head_impl = _Var13._M_head_impl + 1;
      }
      dummyMutex.super___mutex_base._M_mutex._16_8_ = 0;
      dummyMutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      dummyMutex.super___mutex_base._M_mutex.__align = 0;
      dummyMutex.super___mutex_base._M_mutex._8_8_ = 0;
      dummyMutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      std::condition_variable::condition_variable(&dummyConditionVariable);
      std::unique_lock<std::mutex>::unique_lock(&lock,&dummyMutex);
      lVar7 = std::chrono::_V2::system_clock::now();
      local_b0.__d.__r = (duration)((double)lVar7 / 1000000000.0);
      do {
        lVar7 = uVar14 * 0x98;
        _Var13._M_head_impl = _Var6._M_head_impl;
        if (0.0 < local_b8) {
          local_b0.__d.__r = (duration)((double)local_b0.__d.__r + local_b8);
          std::condition_variable::
          __wait_until_impl<std::chrono::duration<double,std::ratio<1l,1l>>>
                    (&dummyConditionVariable,&lock,&local_b0);
        }
        for (; lVar7 != 0; lVar7 = lVar7 + -0x98) {
          *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 5;
          stress_instance::getCount(_Var13._M_head_impl);
          poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
          std::operator<<(poVar4,"M ");
          _Var13._M_head_impl = _Var13._M_head_impl + 0x98;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      } while( true );
    }
    pcVar11 = argv[iVar12];
    if (*pcVar11 != '-') {
LAB_00103487:
      iVar2 = strcmp(pcVar11,"--help");
      if (iVar2 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,*argv);
        poVar4 = std::operator<<(poVar4," [-t threads] [-d delay] [-f]");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"threads is the number of CPUs to use. Default=0. 0=All");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"delay is the number of seconds between updates. ");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"Decimal fractions like 0.5 are allowed. Default=1.");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"Use -f to force it to use more than the number of CPUs");
        std::endl<char,std::char_traits<char>>(poVar4);
        exit(1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dummyMutex,"Invalid switch: ",(allocator<char> *)&lock);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummyMutex;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dummyConditionVariable,__lhs,argv[iVar12]);
      error(_dummyConditionVariable,(int)__lhs);
      goto LAB_00103570;
    }
    if ((pcVar11[1] == 't') && (pcVar11[2] == '\0')) {
      iVar12 = iVar12 + 1;
      if (argc <= iVar12) {
        error("Missing argument to thread count option (-t)",iVar2);
LAB_0010380c:
        error("Missing argument to iteration count option (-i)",iVar2);
LAB_00103818:
        error("Missing argument to delay option (-d)",iVar2);
        std::unique_lock<std::mutex>::~unique_lock(&lock);
        std::condition_variable::~condition_variable(&dummyConditionVariable);
        std::unique_ptr<stress_instance[],_std::default_delete<stress_instance[]>_>::~unique_ptr
                  (&instances);
        _Unwind_Resume(extraout_RAX);
      }
      uVar1 = atoi(argv[iVar12]);
    }
    else if ((pcVar11[1] == 'i') && (pcVar11[2] == '\0')) {
      iVar12 = iVar12 + 1;
      if (argc <= iVar12) goto LAB_0010380c;
      atoi(argv[iVar12]);
    }
    else if ((pcVar11[1] == 'd') && (pcVar11[2] == '\0')) {
      iVar12 = iVar12 + 1;
      if (argc <= iVar12) goto LAB_00103818;
      local_b8 = atof(argv[iVar12]);
      if (local_b8 <= 0.0) {
        local_b8 = 0.0;
      }
    }
    else if ((pcVar11[1] != 'f') || (bVar10 = true, pcVar11[2] != '\0')) goto LAB_00103487;
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int threads = 0;
    bool force = false;
    int timeLimit = -1;
    double interval = 1.0;

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp(argv[i], "-t"))
        {
            if (i + 1 >= argc)
                error("Missing argument to thread count option (-t)");
            threads = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-i"))
        {
            if (i + 1 >= argc)
                error("Missing argument to iteration count option (-i)");
            timeLimit = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-d"))
        {
            if (i + 1 >= argc)
                error("Missing argument to delay option (-d)");
            interval = (std::max)(0.0, atof(argv[++i]));
        }
        else if (!strcmp(argv[i], "-f"))
        {
            force = true;
        }
        else if (!strcmp(argv[i], "--help"))
        {
            std::cerr << argv[0] << " [-t threads] [-d delay] [-f]" << std::endl <<
                std::endl <<
                "threads is the number of CPUs to use. Default=0. 0=All" << std::endl <<
                std::endl <<
                "delay is the number of seconds between updates. " << std::endl <<
                "Decimal fractions like 0.5 are allowed. Default=1." << std::endl <<
                std::endl <<
                "Use -f to force it to use more than the number of CPUs" << std::endl;
            exit(1);
        }
        else
        {
            error((std::string("Invalid switch: ") + argv[i]).c_str());
        }
    }

    std::size_t cpuCount = std::thread::hardware_concurrency();

    if (threads <= 0)
    {
        std::cerr << "Using all " << cpuCount << " CPUs" << std::endl;
        threads = cpuCount;
    }

    if (threads > cpuCount)
    {
        if (force)
        {
            std::cerr << "Warning, forced to use more threads"
                         " than CPUs, " << threads << " threads,"
                         " but only " << cpuCount <<
                         " CPUs detected!" << std::endl;
        }
        else
        {
            std::cerr << "Capping to " << cpuCount <<
                    ". Use -f to override." << std::endl;
            threads = cpuCount;
        }
    }

    if (threads > max_threads)
    {
        std::cerr << "Capping to " << max_threads <<
                ". Recompile with higher max_threads." << std::endl;
        threads = max_threads;
    }

    return run_stress(threads, timeLimit, interval);
}